

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::npf::uberTextureLookup(npf *this,vec2 *uv)

{
  const_reference pvVar1;
  vec3 vVar2;
  int idx;
  int i2;
  int i1;
  vec2 *uv_local;
  npf *this_local;
  
  idx = (int)(uv->x * 512.0);
  if (0x1ff < idx) {
    idx = 0x1ff;
  }
  if (idx < 0) {
    idx = 0;
  }
  pvVar1 = std::vector<djb::vec3,_std::allocator<djb::vec3>_>::operator[]
                     (&this->m_uber_texture,(long)(idx + this->m_id * 0x200));
  vVar2.x = pvVar1->x;
  vVar2.y = pvVar1->y;
  vVar2.z = pvVar1->z;
  return vVar2;
}

Assistant:

vec3 npf::uberTextureLookup(const vec2 &uv) const
{
#if 0
	vec3 color = spline::eval2d(m_uber_texture, 512, 256,
	                            spline::uwrap_edge, uv.x,
	                            spline::uwrap_edge, uv.y);
	return color;
#else
	int i1 = uv.x * 512; if (i1 > 511) i1 = 511; if (i1 < 0) i1 = 0;
	int i2 = m_id;
	int idx = i1 + 512 * i2;
	return m_uber_texture[idx];
#endif
}